

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O1

Status __thiscall
soplex::SPxSolverBase<double>::getPrimalSol
          (SPxSolverBase<double> *this,VectorBase<double> *p_vector)

{
  Status *pSVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  SPxId *pSVar5;
  int iVar6;
  Status SVar7;
  long lVar8;
  undefined8 *puVar9;
  long lVar10;
  pointer pdVar11;
  double dVar12;
  DataKey local_60;
  long local_58;
  undefined1 local_50 [16];
  double local_40;
  DataKey local_38;
  
  if (this->initialized == false) {
    SVar7 = status(this);
    if (SVar7 != NO_PROBLEM) {
      puVar9 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_60 = (DataKey)local_50;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"XSOLVE06 Not Initialized","");
      *puVar9 = &PTR__SPxException_006a9ee8;
      puVar9[1] = puVar9 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar9 + 1),local_60,(undefined1 *)(local_58 + (long)local_60));
      *puVar9 = &PTR__SPxException_006aa100;
      __cxa_throw(puVar9,&SPxStatusException::typeinfo,SPxException::~SPxException);
    }
  }
  else if (this->theRep == ROW) {
    VectorBase<double>::operator=(p_vector,&this->theCoPvec->super_VectorBase<double>);
  }
  else {
    lVar8 = (long)(this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>
                  .set.thenum;
    if (0 < lVar8) {
      pSVar1 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
      pdVar2 = (p_vector->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      pdVar4 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      lVar10 = 0;
      do {
        pdVar11 = pdVar3;
        switch(pSVar1[lVar10]) {
        case D_FREE:
        case D_ON_UPPER:
        case D_ON_LOWER:
        case D_ON_BOTH:
        case D_UNDEFINED:
          goto switchD_001bb592_caseD_1;
        case P_FIXED:
        case P_ON_UPPER:
          pdVar11 = pdVar4;
        case P_ON_LOWER:
          dVar12 = pdVar11[lVar10];
          break;
        default:
          puVar9 = (undefined8 *)__cxa_allocate_exception(0x28);
          local_60 = (DataKey)local_50;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_60,"XSOLVE07 This should never happen.","");
          *puVar9 = &PTR__SPxException_006a9ee8;
          puVar9[1] = puVar9 + 3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(puVar9 + 1),local_60,(undefined1 *)(local_58 + (long)local_60));
          *puVar9 = &PTR__SPxException_006a9ec0;
          __cxa_throw(puVar9,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
        case P_FREE:
          dVar12 = 0.0;
        }
        pdVar2[lVar10] = dVar12;
switchD_001bb592_caseD_1:
        lVar10 = lVar10 + 1;
      } while (lVar8 != lVar10);
    }
    if (0 < (this->thecovectors->set).thenum) {
      lVar8 = 0;
      do {
        pSVar5 = (this->super_SPxBasisBase<double>).theBaseId.data;
        if (0 < pSVar5[lVar8].super_DataKey.info) {
          local_40 = (this->theFvec->super_VectorBase<double>).val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar8];
          local_38 = pSVar5[lVar8].super_DataKey;
          SPxColId::SPxColId((SPxColId *)&local_60,(SPxId *)&local_38);
          iVar6 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                            (&(this->super_SPxLPBase<double>).super_LPColSetBase<double>.
                              super_SVSetBase<double>.set,&local_60);
          (p_vector->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar6] = local_40;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < (this->thecovectors->set).thenum);
    }
  }
  SVar7 = status(this);
  return SVar7;
}

Assistant:

typename SPxSolverBase<R>::Status SPxSolverBase<R>::getPrimalSol(VectorBase<R>& p_vector) const
{

   if(!isInitialized())
   {
      /* exit if presolving/simplifier cleared the problem */
      if(status() == NO_PROBLEM)
         return status();

      throw SPxStatusException("XSOLVE06 Not Initialized");
   }

   if(rep() == ROW)
      p_vector = coPvec();
   else
   {
      const typename SPxBasisBase<R>::Desc& ds = this->desc();

      for(int i = 0; i < this->nCols(); ++i)
      {
         switch(ds.colStatus(i))
         {
         case SPxBasisBase<R>::Desc::P_ON_LOWER :
            p_vector[i] = SPxLPBase<R>::lower(i);
            break;

         case SPxBasisBase<R>::Desc::P_ON_UPPER :
         case SPxBasisBase<R>::Desc::P_FIXED :
            p_vector[i] = SPxLPBase<R>::upper(i);
            break;

         case SPxBasisBase<R>::Desc::P_FREE :
            p_vector[i] = 0;
            break;

         case SPxBasisBase<R>::Desc::D_FREE :
         case SPxBasisBase<R>::Desc::D_ON_UPPER :
         case SPxBasisBase<R>::Desc::D_ON_LOWER :
         case SPxBasisBase<R>::Desc::D_ON_BOTH :
         case SPxBasisBase<R>::Desc::D_UNDEFINED :
            break;

         default:
            throw SPxInternalCodeException("XSOLVE07 This should never happen.");
         }
      }

      for(int j = 0; j < dim(); ++j)
      {
         if(this->baseId(j).isSPxColId())
            p_vector[ this->number(SPxColId(this->baseId(j))) ] = fVec()[j];
      }
   }

   return status();
}